

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

void BrotliWriteHuffmanTree
               (uint8_t *depth,size_t length,size_t *tree_size,uint8_t *tree,
               uint8_t *extra_bits_data)

{
  uint8_t value_00;
  bool bVar1;
  ulong local_68;
  size_t k;
  size_t reps;
  size_t sStack_50;
  uint8_t value;
  size_t new_length;
  int use_rle_for_zero;
  int use_rle_for_non_zero;
  size_t i;
  uint8_t *puStack_30;
  uint8_t previous_value;
  uint8_t *extra_bits_data_local;
  uint8_t *tree_local;
  size_t *tree_size_local;
  size_t length_local;
  uint8_t *depth_local;
  
  i._7_1_ = '\b';
  new_length._4_4_ = 0;
  new_length._0_4_ = 0;
  _use_rle_for_zero = 0;
  sStack_50 = length;
  while ((_use_rle_for_zero < length && (depth[(length - _use_rle_for_zero) + -1] == '\0'))) {
    sStack_50 = sStack_50 - 1;
    _use_rle_for_zero = _use_rle_for_zero + 1;
  }
  puStack_30 = extra_bits_data;
  extra_bits_data_local = tree;
  tree_local = (uint8_t *)tree_size;
  tree_size_local = (size_t *)length;
  length_local = (size_t)depth;
  if (0x32 < length) {
    DecideOverRleUse(depth,sStack_50,(int *)((long)&new_length + 4),(int *)&new_length);
  }
  for (_use_rle_for_zero = 0; _use_rle_for_zero < sStack_50;
      _use_rle_for_zero = k + _use_rle_for_zero) {
    value_00 = *(uint8_t *)(length_local + _use_rle_for_zero);
    k = 1;
    local_68 = _use_rle_for_zero;
    if (((value_00 != '\0') && (new_length._4_4_ != 0)) ||
       ((value_00 == '\0' && ((int)new_length != 0)))) {
      while( true ) {
        local_68 = local_68 + 1;
        bVar1 = false;
        if (local_68 < sStack_50) {
          bVar1 = *(uint8_t *)(length_local + local_68) == value_00;
        }
        if (!bVar1) break;
        k = k + 1;
      }
    }
    if (value_00 == '\0') {
      BrotliWriteHuffmanTreeRepetitionsZeros
                (k,(size_t *)tree_local,extra_bits_data_local,puStack_30);
    }
    else {
      BrotliWriteHuffmanTreeRepetitions
                (i._7_1_,value_00,k,(size_t *)tree_local,extra_bits_data_local,puStack_30);
      i._7_1_ = value_00;
    }
  }
  return;
}

Assistant:

void BrotliWriteHuffmanTree(const uint8_t* depth,
                            size_t length,
                            size_t* tree_size,
                            uint8_t* tree,
                            uint8_t* extra_bits_data) {
  uint8_t previous_value = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
  size_t i;
  BROTLI_BOOL use_rle_for_non_zero = BROTLI_FALSE;
  BROTLI_BOOL use_rle_for_zero = BROTLI_FALSE;

  /* Throw away trailing zeros. */
  size_t new_length = length;
  for (i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  /* First gather statistics on if it is a good idea to do RLE. */
  if (length > 50) {
    /* Find RLE coding for longer codes.
       Shorter codes seem not to benefit from RLE. */
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  /* Actual RLE coding. */
  for (i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      size_t k;
      for (k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      BrotliWriteHuffmanTreeRepetitionsZeros(
          reps, tree_size, tree, extra_bits_data);
    } else {
      BrotliWriteHuffmanTreeRepetitions(previous_value,
                                        value, reps, tree_size,
                                        tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}